

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::rename_file(torrent *this,file_index_t index,string *name)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  alert_manager *paVar3;
  undefined4 extraout_var;
  enable_shared_from_this<libtorrent::aux::torrent> local_d8;
  code *local_c8;
  undefined8 local_c0;
  type local_b8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_const_libtorrent::storage_error_&)>
  local_98;
  string local_78 [36];
  int local_54;
  uint local_50;
  error_code_enum local_3c;
  undefined1 local_38 [24];
  file_storage *fs;
  string *name_local;
  torrent *this_local;
  file_index_t index_local;
  
  fs = (file_storage *)name;
  name_local = (string *)this;
  this_local._4_4_ = index.m_val;
  this_00 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  local_38._16_8_ = torrent_info::files(this_00);
  bVar1 = storage_holder::operator_cast_to_bool(&this->m_storage);
  if (bVar1) {
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [4])();
    local_50 = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
    local_54 = this_local._4_4_;
    ::std::__cxx11::string::string(local_78,(string *)name);
    local_c8 = on_file_renamed;
    local_c0 = 0;
    ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_d8);
    ::std::
    bind<void(libtorrent::aux::torrent::*)(std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error_const&),std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
              (&local_b8,(offset_in_torrent_to_subr *)&local_c8,
               (shared_ptr<libtorrent::aux::torrent> *)&local_d8,
               (_Placeholder<1> *)&::std::placeholders::_1,
               (_Placeholder<2> *)&::std::placeholders::_2,
               (_Placeholder<3> *)&::std::placeholders::_3);
    ::std::
    function<void(std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error_const&)>
    ::
    function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error_const&)>,void>
              ((function<void(std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error_const&)>
                *)&local_98,&local_b8);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x50))
              ((long *)CONCAT44(extraout_var,iVar2),local_50,local_54,local_78,&local_98);
    ::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_const_libtorrent::storage_error_&)>
    ::~function(&local_98);
    ::std::
    _Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_const_libtorrent::storage_error_&)>
    ::~_Bind(&local_b8);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)&local_d8);
    ::std::__cxx11::string::~string(local_78);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  else {
    paVar3 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::file_rename_failed_alert>(paVar3);
    if (bVar1) {
      paVar3 = alerts(this);
      get_handle((torrent *)local_38);
      local_3c = session_is_closing;
      alert_manager::
      emplace_alert<libtorrent::file_rename_failed_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&,libtorrent::errors::error_code_enum>
                (paVar3,(torrent_handle *)local_38,
                 (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                 ((long)&this_local + 4),&local_3c);
      torrent_handle::~torrent_handle((torrent_handle *)local_38);
    }
  }
  return;
}

Assistant:

void torrent::rename_file(file_index_t const index, std::string name)
	{
		INVARIANT_CHECK;

		file_storage const& fs = m_torrent_file->files();
		TORRENT_ASSERT(index >= file_index_t(0));
		TORRENT_ASSERT(index < fs.end_file());
		TORRENT_UNUSED(fs);

		// storage may be nullptr during shutdown
		if (!m_storage)
		{
			if (alerts().should_post<file_rename_failed_alert>())
				alerts().emplace_alert<file_rename_failed_alert>(get_handle()
					, index, errors::session_is_closing);
			return;
		}

		m_ses.disk_thread().async_rename_file(m_storage, index, std::move(name)
			, std::bind(&torrent::on_file_renamed, shared_from_this(), _1, _2, _3));
		m_ses.deferred_submit_jobs();
	}